

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O0

void __thiscall
QPDFSystemError::QPDFSystemError(QPDFSystemError *this,string *description,int system_errno)

{
  string local_40;
  int local_1c;
  string *psStack_18;
  int system_errno_local;
  string *description_local;
  QPDFSystemError *this_local;
  
  local_1c = system_errno;
  psStack_18 = description;
  description_local = (string *)this;
  createWhat(&local_40,description,system_errno);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__QPDFSystemError_0058eff0;
  std::__cxx11::string::string((string *)&this->description,(string *)psStack_18);
  this->system_errno = local_1c;
  return;
}

Assistant:

QPDFSystemError::QPDFSystemError(std::string const& description, int system_errno) :
    std::runtime_error(createWhat(description, system_errno)),
    description(description),
    system_errno(system_errno)
{
}